

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O2

string * __thiscall
cppcms::session_interface::get_csrf_token_abi_cxx11_
          (string *__return_storage_ptr__,session_interface *this)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"_csrf",&local_51);
  std::__cxx11::string::string((string *)&local_50,"",&local_52);
  get(__return_storage_ptr__,this,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string session_interface::get_csrf_token()
{
	return get("_csrf","");
}